

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O0

void __thiscall
Eigen::IOFormat::IOFormat
          (IOFormat *this,int _precision,int _flags,string *_coeffSeparator,string *_rowSeparator,
          string *_rowPrefix,string *_rowSuffix,string *_matPrefix,string *_matSuffix,char _fill)

{
  char *pcVar1;
  bool bVar2;
  int local_44;
  allocator<char> local_3d;
  int i;
  string *local_30;
  string *_rowPrefix_local;
  string *_rowSeparator_local;
  string *_coeffSeparator_local;
  int _flags_local;
  int _precision_local;
  IOFormat *this_local;
  
  local_30 = _rowPrefix;
  _rowPrefix_local = _rowSeparator;
  _rowSeparator_local = _coeffSeparator;
  _coeffSeparator_local._0_4_ = _flags;
  _coeffSeparator_local._4_4_ = _precision;
  __flags_local = this;
  std::__cxx11::string::string((string *)this,(string *)_matPrefix);
  std::__cxx11::string::string((string *)&this->matSuffix,(string *)_matSuffix);
  std::__cxx11::string::string((string *)&this->rowPrefix,(string *)local_30);
  std::__cxx11::string::string((string *)&this->rowSuffix,(string *)_rowSuffix);
  std::__cxx11::string::string((string *)&this->rowSeparator,(string *)_rowPrefix_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->rowSpacer,"",&local_3d);
  std::allocator<char>::~allocator(&local_3d);
  std::__cxx11::string::string((string *)&this->coeffSeparator,(string *)_rowSeparator_local);
  this->fill = _fill;
  this->precision = _coeffSeparator_local._4_4_;
  this->flags = (int)_coeffSeparator_local;
  if ((this->flags & 1U) == 0) {
    local_44 = std::__cxx11::string::length();
    while( true ) {
      local_44 = local_44 + -1;
      bVar2 = false;
      if (-1 < local_44) {
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)&this->matSuffix);
        bVar2 = *pcVar1 != '\n';
      }
      if (!bVar2) break;
      std::__cxx11::string::operator+=((string *)&this->rowSpacer,' ');
    }
  }
  return;
}

Assistant:

IOFormat(int _precision = StreamPrecision, int _flags = 0,
    const std::string& _coeffSeparator = " ",
    const std::string& _rowSeparator = "\n", const std::string& _rowPrefix="", const std::string& _rowSuffix="",
    const std::string& _matPrefix="", const std::string& _matSuffix="", const char _fill=' ')
  : matPrefix(_matPrefix), matSuffix(_matSuffix), rowPrefix(_rowPrefix), rowSuffix(_rowSuffix), rowSeparator(_rowSeparator),
    rowSpacer(""), coeffSeparator(_coeffSeparator), fill(_fill), precision(_precision), flags(_flags)
  {
    // TODO check if rowPrefix, rowSuffix or rowSeparator contains a newline
    // don't add rowSpacer if columns are not to be aligned
    if((flags & DontAlignCols))
      return;
    int i = int(matSuffix.length())-1;
    while (i>=0 && matSuffix[i]!='\n')
    {
      rowSpacer += ' ';
      i--;
    }
  }